

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::Enter
          (UniqueLock<AnnotatedMixin<std::mutex>_> *this,char *pszName,char *pszFile,int nLine)

{
  long lVar1;
  int in_ECX;
  mutex *in_RDX;
  unique_lock<std::mutex> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = in_ECX;
  std::unique_lock<std::mutex>::mutex(in_RSI);
  EnterCritical<std::mutex>
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_RDI,in_ECX,in_RDX,
             SUB81((ulong)in_RSI >> 0x38,0));
  std::unique_lock<std::mutex>::lock(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Enter(const char* pszName, const char* pszFile, int nLine)
    {
        EnterCritical(pszName, pszFile, nLine, Base::mutex());
#ifdef DEBUG_LOCKCONTENTION
        if (Base::try_lock()) return;
        LOG_TIME_MICROS_WITH_CATEGORY(strprintf("lock contention %s, %s:%d", pszName, pszFile, nLine), BCLog::LOCK);
#endif
        Base::lock();
    }